

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmInfo.cpp
# Opt level: O0

void GmmDestroyMultiAdapterContext(void)

{
  GMM_MA_LIB_CONTEXT *this;
  uint32_t uVar1;
  void *in_RSI;
  
  if ((pGmmMALibContext != (GMM_MA_LIB_CONTEXT *)0x0) &&
     (uVar1 = GmmLib::GmmMultiAdapterContext::GetNumAdapters(pGmmMALibContext),
     this = pGmmMALibContext, uVar1 == 0)) {
    if (pGmmMALibContext != (GMM_MA_LIB_CONTEXT *)0x0) {
      GmmLib::GmmMultiAdapterContext::~GmmMultiAdapterContext(pGmmMALibContext);
      GmmMemAllocator::operator_delete((GmmMemAllocator *)this,in_RSI);
    }
    pGmmMALibContext = (GMM_MA_LIB_CONTEXT *)0x0;
  }
  return;
}

Assistant:

GMM_LIB_API_DESTRUCTOR void GmmDestroyMultiAdapterContext()
{
    if(pGmmMALibContext)
    {
        // Before destroying GmmMultiAdapterContext, check if all the Adapters have
        // their GmmLibContext destroyed.
        // At this point the linked list is empty and pHeadNode = NULL & NumAdapter=0.
	if(!pGmmMALibContext->GetNumAdapters())
        {
            delete pGmmMALibContext;
            pGmmMALibContext = NULL;
        }
    }
}